

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__linear_to_rgbe(uchar *rgbe,float *linear)

{
  float fVar1;
  uchar uVar2;
  uchar uVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  int exponent;
  char local_1c [4];
  
  fVar1 = *linear;
  fVar4 = linear[1];
  if (linear[1] <= linear[2]) {
    fVar4 = linear[2];
  }
  fVar5 = fVar1;
  if (fVar1 <= fVar4) {
    fVar5 = fVar4;
  }
  if (1e-32 <= fVar5) {
    dVar6 = frexp((double)fVar5,(int *)local_1c);
    fVar5 = ((float)dVar6 * 256.0) / fVar5;
    *rgbe = (uchar)(int)(fVar1 * fVar5);
    rgbe[1] = (uchar)(int)(linear[1] * fVar5);
    uVar3 = (uchar)(int)(fVar5 * linear[2]);
    uVar2 = local_1c[0] + 0x80;
  }
  else {
    rgbe[0] = '\0';
    rgbe[1] = '\0';
    uVar2 = '\0';
    uVar3 = '\0';
  }
  rgbe[3] = uVar2;
  rgbe[2] = uVar3;
  return;
}

Assistant:

void stbiw__linear_to_rgbe(unsigned char *rgbe, float *linear)
{
   int exponent;
   float maxcomp = stbiw__max(linear[0], stbiw__max(linear[1], linear[2]));

   if (maxcomp < 1e-32f) {
      rgbe[0] = rgbe[1] = rgbe[2] = rgbe[3] = 0;
   } else {
      float normalize = (float) frexp(maxcomp, &exponent) * 256.0f/maxcomp;

      rgbe[0] = (unsigned char)(linear[0] * normalize);
      rgbe[1] = (unsigned char)(linear[1] * normalize);
      rgbe[2] = (unsigned char)(linear[2] * normalize);
      rgbe[3] = (unsigned char)(exponent + 128);
   }
}